

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qeffects.cpp
# Opt level: O3

void __thiscall QAlphaWidget::run(QAlphaWidget *this,int time)

{
  Data *pDVar1;
  undefined8 uVar2;
  char cVar3;
  int iVar4;
  long lVar5;
  undefined4 *puVar6;
  long in_FS_OFFSET;
  QObject local_a0 [8];
  undefined8 local_98;
  undefined8 uStack_90;
  undefined1 local_88 [24];
  code *local_70;
  QWidgetData *local_68;
  undefined8 local_60;
  QSize local_58;
  undefined1 *puStack_50;
  undefined1 *local_48;
  long local_38;
  
  iVar4 = 0x96;
  if (-1 < time) {
    iVar4 = time;
  }
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this->duration = iVar4;
  pDVar1 = (this->widget).wp.d;
  if (((pDVar1 != (Data *)0x0) && (*(int *)(pDVar1 + 4) != 0)) &&
     ((this->widget).wp.value != (QObject *)0x0)) {
    this->elapsed = 0;
    QElapsedTimer::start();
    this->showWidget = true;
    QWidget::setAttribute((QWidget *)(this->widget).wp.value,WA_WState_ExplicitShowHide,true);
    QWidget::setAttribute((QWidget *)(this->widget).wp.value,WA_WState_Hidden,false);
    QObject::installEventFilter(QCoreApplication::self);
    local_58 = *(QSize *)(*(long *)((this->widget).wp.value + 0x20) + 0x14);
    QWidget::move(&this->super_QWidget,(QPoint *)&local_58);
    lVar5 = *(long *)((this->widget).wp.value + 0x20);
    local_58.ht.m_i = (*(int *)(lVar5 + 0x20) - *(int *)(lVar5 + 0x18)) + 1;
    local_58.wd.m_i = (*(int *)(lVar5 + 0x1c) - *(int *)(lVar5 + 0x14)) + 1;
    QWidget::resize(&this->super_QWidget,&local_58);
    local_98 = 0;
    uStack_90 = 0xfffffffefffffffe;
    QWidget::grab((QWidget *)local_88,(QRect *)(this->widget).wp.value);
    QPixmap::toImage();
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    local_58 = (QSize)&DAT_aaaaaaaaaaaaaaaa;
    puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
    QPaintDevice::QPaintDevice((QPaintDevice *)&local_58);
    uVar2 = local_60;
    local_58 = (QSize)QFileSystemModel::setResolveSymlinks;
    local_60 = 0;
    local_48 = *(undefined1 **)&this->field_0x70;
    *(undefined8 *)&this->field_0x70 = uVar2;
    QImage::~QImage((QImage *)&local_58);
    QImage::~QImage((QImage *)&local_70);
    QPixmap::~QPixmap((QPixmap *)local_88);
    iVar4 = QGuiApplication::primaryScreen();
    lVar5 = *(long *)((this->widget).wp.value + 0x20);
    QScreen::grabWindow((ulonglong)local_88,iVar4,0,*(int *)(lVar5 + 0x14),*(int *)(lVar5 + 0x18));
    QPixmap::toImage();
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    local_58 = (QSize)&DAT_aaaaaaaaaaaaaaaa;
    puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
    QPaintDevice::QPaintDevice((QPaintDevice *)&local_58);
    uVar2 = local_60;
    local_58 = (QSize)QFileSystemModel::setResolveSymlinks;
    local_60 = 0;
    local_48 = *(undefined1 **)&this->field_0x58;
    *(undefined8 *)&this->field_0x58 = uVar2;
    QImage::~QImage((QImage *)&local_58);
    QImage::~QImage((QImage *)&local_70);
    QPixmap::~QPixmap((QPixmap *)local_88);
    cVar3 = QImage::isNull();
    if (cVar3 == '\0') {
      lVar5 = QElapsedTimer::elapsed();
      if (lVar5 < this->duration / 2) {
        local_88._0_8_ = 0;
        local_88._8_8_ = 0xffffffffffffffff;
        QImage::copy((QRect *)&local_70);
        local_48 = &DAT_aaaaaaaaaaaaaaaa;
        local_58 = (QSize)&DAT_aaaaaaaaaaaaaaaa;
        puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
        QPaintDevice::QPaintDevice((QPaintDevice *)&local_58);
        uVar2 = local_60;
        local_58 = (QSize)QFileSystemModel::setResolveSymlinks;
        local_60 = 0;
        local_48 = *(undefined1 **)&this->field_0x88;
        *(undefined8 *)&this->field_0x88 = uVar2;
        QImage::~QImage((QImage *)&local_58);
        QImage::~QImage((QImage *)&local_70);
        QPixmap::fromImage((QPixmap *)&local_70,&this->mixedImage,0);
        local_48 = &DAT_aaaaaaaaaaaaaaaa;
        local_58 = (QSize)&DAT_aaaaaaaaaaaaaaaa;
        puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
        QPaintDevice::QPaintDevice((QPaintDevice *)&local_58);
        uVar2 = local_60;
        local_58 = (QSize)QDataStream::operator<<;
        local_60 = 0;
        local_48 = *(undefined1 **)&this->field_0x38;
        *(undefined8 *)&this->field_0x38 = uVar2;
        QPixmap::~QPixmap((QPixmap *)&local_58);
        QPixmap::~QPixmap((QPixmap *)&local_70);
        QWidget::show(&this->super_QWidget);
        QWidget::setEnabled(&this->super_QWidget,false);
        local_70 = render;
        local_68 = (QWidgetData *)0x0;
        local_58 = (QSize)QTimer::timeout;
        puStack_50 = (undefined1 *)0x0;
        puVar6 = (undefined4 *)operator_new(0x20);
        *puVar6 = 1;
        *(code **)(puVar6 + 2) =
             QtPrivate::QCallableObject<void_(QAlphaWidget::*)(),_QtPrivate::List<>,_void>::impl;
        *(code **)(puVar6 + 4) = render;
        *(undefined8 *)(puVar6 + 6) = 0;
        QObject::connectImpl
                  (local_a0,(void **)&this->anim,(QObject *)&local_58,(void **)this,
                   (QSlotObjectBase *)&local_70,(ConnectionType)puVar6,(int *)0x0,(QMetaObject *)0x0
                  );
        QMetaObject::Connection::~Connection((Connection *)local_a0);
        QTimer::start((int)&this->anim);
        goto LAB_00403fff;
      }
    }
    this->duration = 0;
    render(this);
  }
LAB_00403fff:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QAlphaWidget::run(int time)
{
    duration = time;

    if (duration < 0)
        duration = 150;

    if (!widget)
        return;

    elapsed = 0;
    checkTime.start();

    showWidget = true;
#if defined(Q_OS_WIN)
    qApp->installEventFilter(this);
    widget->setWindowOpacity(0.0);
    widget->show();
    connect(&anim, &QTimer::timeout, this, &QAlphaWidget::render);
    anim.start(1);
#else
    //This is roughly equivalent to calling setVisible(true) without actually showing the widget
    widget->setAttribute(Qt::WA_WState_ExplicitShowHide, true);
    widget->setAttribute(Qt::WA_WState_Hidden, false);

    qApp->installEventFilter(this);

    move(widget->geometry().x(),widget->geometry().y());
    resize(widget->size().width(), widget->size().height());

    frontImage = widget->grab().toImage();
    backImage = QGuiApplication::primaryScreen()->grabWindow(0,
                                widget->geometry().x(), widget->geometry().y(),
                                widget->geometry().width(), widget->geometry().height()).toImage();

    if (!backImage.isNull() && checkTime.elapsed() < duration / 2) {
        mixedImage = backImage.copy();
        pm = QPixmap::fromImage(mixedImage);
        show();
        setEnabled(false);

        connect(&anim, &QTimer::timeout, this, &QAlphaWidget::render);
        anim.start(1);
    } else {
       duration = 0;
       render();
    }
#endif
}